

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezone.cpp
# Opt level: O2

QDataStream * operator>>(QDataStream *ds,QTimeZone *tz)

{
  Data DVar1;
  int iVar2;
  bool bVar3;
  int iVar4;
  QDataStream *pQVar5;
  long lVar6;
  QTimeZonePrivate *pQVar7;
  long in_FS_OFFSET;
  QArrayDataPointer<char> local_c8;
  Data local_b0;
  QArrayDataPointer<char16_t> local_a8;
  int territory;
  int utcOffset_1;
  undefined4 uStack_84;
  char16_t *pcStack_80;
  qsizetype local_78;
  int utcOffset;
  Data local_68;
  char *pcStack_60;
  undefined8 local_58;
  QArrayDataPointer<char16_t> local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.d = (Data *)0x0;
  local_48.ptr = (char16_t *)0x0;
  local_48.size = 0;
  operator>>(ds,(QString *)&local_48);
  invalidId();
  bVar3 = comparesEqual((QString *)&local_48,(QString *)&local_68.s);
  QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68.s);
  if (bVar3) {
    QTimeZone::QTimeZone((QTimeZone *)&local_68.s);
    DVar1.s = *(ShortData *)&tz->d;
    tz->d = local_68;
    local_68.s = DVar1.s;
  }
  else {
    local_68 = (Data)0xd;
    pcStack_60 = "OffsetFromUtc";
    bVar3 = operator==((QString *)&local_48,(QLatin1StringView *)&local_68.s);
    if (bVar3) {
      utcOffset = -0x55555556;
      local_68.d = (QTimeZonePrivate *)0x0;
      pcStack_60 = (char *)0x0;
      local_58 = 0;
      _utcOffset_1 = (QTimeZonePrivate *)0x0;
      pcStack_80 = (char16_t *)0x0;
      local_78 = 0;
      territory = -0x55555556;
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char16_t *)0x0;
      local_a8.size = 0;
      pQVar5 = operator>>(ds,(QString *)&local_48);
      pQVar5 = QDataStream::operator>>(pQVar5,&utcOffset);
      pQVar5 = operator>>(pQVar5,(QString *)&local_68.s);
      pQVar5 = operator>>(pQVar5,(QString *)&utcOffset_1);
      pQVar5 = QDataStream::operator>>(pQVar5,&territory);
      operator>>(pQVar5,(QString *)&local_a8);
      QString::toUtf8_helper((QByteArray *)&local_c8,(QString *)&local_48);
      QTimeZone::QTimeZone((QTimeZone *)&local_b0.s,(QByteArray *)&local_c8);
      DVar1.s = *(ShortData *)&tz->d;
      tz->d = local_b0;
      local_b0.s = DVar1.s;
      QTimeZone::~QTimeZone((QTimeZone *)&local_b0.s);
      QArrayDataPointer<char>::~QArrayDataPointer(&local_c8);
      bVar3 = QTimeZone::isValid(tz);
      if ((!bVar3) || (bVar3 = QTimeZone::hasDaylightTime(tz), bVar3)) {
LAB_00316efe:
        QString::toUtf8_helper((QByteArray *)&local_c8,(QString *)&local_48);
        QTimeZone::QTimeZone
                  ((QTimeZone *)&local_b0.s,(QByteArray *)&local_c8,utcOffset,(QString *)&local_68.s
                   ,(QString *)&utcOffset_1,(Territory)territory,(QString *)&local_a8);
        DVar1.s = *(ShortData *)&tz->d;
        tz->d = local_b0;
        local_b0.s = DVar1.s;
        QTimeZone::~QTimeZone((QTimeZone *)&local_b0.s);
        QArrayDataPointer<char>::~QArrayDataPointer(&local_c8);
      }
      else {
        local_b0 = (Data)0x2;
        QDateTime::fromMSecsSinceEpoch((QDateTime *)&local_c8,0,(QTimeZone *)&local_b0.s);
        iVar4 = QTimeZone::offsetFromUtc(tz,(QDateTime *)&local_c8);
        iVar2 = utcOffset;
        QDateTime::~QDateTime((QDateTime *)&local_c8);
        QTimeZone::~QTimeZone((QTimeZone *)&local_b0.s);
        if (iVar4 != iVar2) goto LAB_00316efe;
      }
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&utcOffset_1);
      QArrayDataPointer<char16_t>::~QArrayDataPointer((QArrayDataPointer<char16_t> *)&local_68.s);
      goto LAB_00317058;
    }
    local_68 = (Data)0xc;
    pcStack_60 = "AheadOfUtcBy";
    bVar3 = operator==((QString *)&local_48,(QLatin1StringView *)&local_68.s);
    if (bVar3) {
      utcOffset_1 = 0xaaaaaaaa;
      QDataStream::operator>>(ds,&utcOffset_1);
      lVar6 = (long)utcOffset_1;
      pQVar7 = (QTimeZonePrivate *)0x0;
      if (lVar6 + 0xe100U < 0x1c201) {
        pQVar7 = (QTimeZonePrivate *)((3 - (ulong)(lVar6 == 0)) + lVar6 * 4);
      }
      local_68.s = *(ShortData *)&tz->d;
      (tz->d).d = pQVar7;
    }
    else {
      local_68 = (Data)0xe;
      pcStack_60 = "QTimeZone::UTC";
      bVar3 = operator==((QString *)&local_48,(QLatin1StringView *)&local_68.s);
      if (bVar3) {
        local_68.s = *(ShortData *)&tz->d;
        tz->d = (Data)0x2;
      }
      else {
        local_68 = (Data)0x14;
        pcStack_60 = "QTimeZone::LocalTime";
        bVar3 = operator==((QString *)&local_48,(QLatin1StringView *)&local_68.s);
        if (!bVar3) {
          QString::toUtf8_helper((QByteArray *)&local_68.s,(QString *)&local_48);
          QTimeZone::QTimeZone((QTimeZone *)&utcOffset_1,(QByteArray *)&local_68.s);
          DVar1.s = *(ShortData *)&tz->d;
          tz->d = _utcOffset_1;
          _utcOffset_1 = DVar1.s;
          QTimeZone::~QTimeZone((QTimeZone *)&utcOffset_1);
          QArrayDataPointer<char>::~QArrayDataPointer((QArrayDataPointer<char> *)&local_68.s);
          goto LAB_00317058;
        }
        local_68.s = *(ShortData *)&tz->d;
        tz->d = (Data)0x1;
      }
    }
  }
  QTimeZone::~QTimeZone((QTimeZone *)&local_68.s);
LAB_00317058:
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_48);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_30) {
    __stack_chk_fail();
  }
  return ds;
}

Assistant:

QDataStream &operator>>(QDataStream &ds, QTimeZone &tz)
{
    QString ianaId;
    ds >> ianaId;
    // That may be various things other than actual IANA IDs:
    if (ianaId == invalidId()) {
        tz = QTimeZone();
    } else if (ianaId == "OffsetFromUtc"_L1) {
        int utcOffset;
        QString name;
        QString abbreviation;
        int territory;
        QString comment;
        ds >> ianaId >> utcOffset >> name >> abbreviation >> territory >> comment;
#if QT_CONFIG(timezone)
        // Try creating as a system timezone, which succeeds (producing a valid
        // zone) iff ianaId is valid; use this if it is a plain offset from UTC
        // zone, with the right offset, ignoring the other data:
        tz = QTimeZone(ianaId.toUtf8());
        if (!tz.isValid() || tz.hasDaylightTime()
            || tz.offsetFromUtc(QDateTime::fromMSecsSinceEpoch(0, QTimeZone::UTC)) != utcOffset) {
            // Construct a custom timezone using the saved values:
            tz = QTimeZone(ianaId.toUtf8(), utcOffset, name, abbreviation,
                           QLocale::Territory(territory), comment);
        }
#else
        tz = QTimeZone::fromSecondsAheadOfUtc(utcOffset);
#endif
    } else if (ianaId == "AheadOfUtcBy"_L1) {
        int utcOffset;
        ds >> utcOffset;
        tz = QTimeZone::fromSecondsAheadOfUtc(utcOffset);
    } else if (ianaId == "QTimeZone::UTC"_L1) {
        tz = QTimeZone(QTimeZone::UTC);
    } else if (ianaId == "QTimeZone::LocalTime"_L1) {
        tz = QTimeZone(QTimeZone::LocalTime);
#if QT_CONFIG(timezone)
    } else {
        tz = QTimeZone(ianaId.toUtf8());
#endif
    }
    return ds;
}